

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

void QPDF::registerStreamFilter
               (string *filter_name,function<std::shared_ptr<QPDFStreamFilter>_()> *factory)

{
  function<std::shared_ptr<QPDFStreamFilter>_()> local_38;
  function<std::shared_ptr<QPDFStreamFilter>_()> *local_18;
  function<std::shared_ptr<QPDFStreamFilter>_()> *factory_local;
  string *filter_name_local;
  
  local_18 = factory;
  factory_local = (function<std::shared_ptr<QPDFStreamFilter>_()> *)filter_name;
  std::function<std::shared_ptr<QPDFStreamFilter>_()>::function(&local_38,factory);
  ::qpdf::Stream::registerStreamFilter(filter_name,&local_38);
  std::function<std::shared_ptr<QPDFStreamFilter>_()>::~function(&local_38);
  return;
}

Assistant:

void
QPDF::registerStreamFilter(
    std::string const& filter_name, std::function<std::shared_ptr<QPDFStreamFilter>()> factory)
{
    qpdf::Stream::registerStreamFilter(filter_name, factory);
}